

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::removeClause(Solver *this,CRef cr,bool remove_from_proof)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  OnlineProofChecker *pOVar4;
  Lit *pLVar5;
  VarData *pVVar6;
  byte in_DL;
  uint in_ESI;
  Solver *in_RDI;
  bool in_stack_0000001b;
  CRef in_stack_0000001c;
  Solver *in_stack_00000020;
  Lit implied;
  Clause *c;
  undefined4 in_stack_ffffffffffffff88;
  Ref in_stack_ffffffffffffff8c;
  Solver *in_stack_ffffffffffffff90;
  Solver *in_stack_ffffffffffffff98;
  OnlineProofChecker *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  uchar op;
  undefined7 in_stack_ffffffffffffffb8;
  lbool in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  lbool local_25;
  int local_24;
  lbool local_1d;
  Lit local_1c;
  Clause *local_18;
  byte local_d;
  uint local_c;
  
  op = (uchar)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  local_d = in_DL & 1;
  local_c = in_ESI;
  local_18 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  (in_RDI->statistics).solveSteps = (in_RDI->statistics).solveSteps + 1;
  detachClause(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
  if ((local_d & 1) != 0) {
    bVar1 = locked((Solver *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (Clause *)CONCAT17(in_stack_ffffffffffffffbf.value,in_stack_ffffffffffffffb8));
    if (bVar1) {
      iVar2 = Clause::size(local_18);
      if (iVar2 == 2) {
        pLVar5 = Clause::operator[](local_18,0);
        local_24 = pLVar5->x;
        local_1d = value(in_stack_ffffffffffffff98,(Lit)(int)in_stack_ffffffffffffffa0);
        lbool::lbool(&local_25,'\0');
        bVar1 = lbool::operator==(&local_1d,local_25);
        if (bVar1) {
          in_stack_ffffffffffffffa0 = (OnlineProofChecker *)Clause::operator[](local_18,0);
          pOVar4 = in_stack_ffffffffffffffa0;
        }
        else {
          in_stack_ffffffffffffffa0 = (OnlineProofChecker *)Clause::operator[](local_18,1);
          pOVar4 = in_stack_ffffffffffffffa0;
        }
      }
      else {
        pOVar4 = (OnlineProofChecker *)Clause::operator[](local_18,0);
      }
      local_1c.x = *(int *)pOVar4;
      in_stack_ffffffffffffff98 = (Solver *)&in_RDI->vardata;
      iVar2 = var(local_1c);
      op = (uchar)((ulong)pOVar4 >> 0x38);
      pVVar6 = vec<Minisat::Solver::VarData>::operator[]
                         ((vec<Minisat::Solver::VarData> *)in_stack_ffffffffffffff98,iVar2);
      pVVar6->reason = 0xffffffff;
      if ((in_RDI->drup_file != (FILE *)0x0) &&
         (in_RDI->onlineDratChecker != (OnlineProofChecker *)0x0)) {
        var(local_1c);
        iVar2 = level(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        if (iVar2 == 0) {
          iVar2 = var(local_1c);
          var(local_1c);
          value((Solver *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
          lbool::lbool((lbool *)&stack0xffffffffffffffbf,'\x01');
          bVar1 = lbool::operator==((lbool *)&stack0xffffffffffffffc7,in_stack_ffffffffffffffbf);
          mkLit(iVar2,bVar1);
          bVar1 = OnlineProofChecker::addClause
                            (in_stack_ffffffffffffffa0,(Lit *)in_stack_ffffffffffffff98);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            exit(0x86);
          }
        }
      }
    }
    if (in_RDI->drup_file != (FILE *)0x0) {
      uVar3 = Clause::mark(local_18);
      if (uVar3 == 1) {
        if (0 < in_RDI->verbosity) {
          printf("c Bug. I don\'t expect this to happen.\n");
        }
      }
      else {
        binDRUP<Minisat::Clause>
                  (in_RDI,op,(Clause *)in_stack_ffffffffffffffa0,(FILE *)in_stack_ffffffffffffff98);
      }
    }
  }
  Clause::mark(local_18,1);
  ClauseAllocator::free(&in_RDI->ca,(void *)(ulong)local_c);
  return;
}

Assistant:

void Solver::removeClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];
    statistics.solveSteps++;

    detachClause(cr);
    // Don't leave pointers to free'd memory!
    if (remove_from_proof) {
        if (locked(c)) {
            Lit implied = c.size() != 2 ? c[0] : (value(c[0]) == l_True ? c[0] : c[1]);
            vardata[var(implied)].reason = CRef_Undef;
            if (drup_file && onlineDratChecker && level(var(implied)) == 0) { /* before we drop the reason, store a unit */
                if (!onlineDratChecker->addClause(mkLit(var(implied), value(var(implied)) == l_False))) exit(134);
            }
        }
        if (drup_file) {
            if (c.mark() != 1) {
#ifdef BIN_DRUP
                binDRUP('d', c, drup_file);
#else
                fprintf(drup_file, "d ");
                for (int i = 0; i < c.size(); i++) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
                fprintf(drup_file, "0\n");
#endif
            } else if (verbosity >= 1) {
                printf("c Bug. I don't expect this to happen.\n");
            }
        }
    }

    c.mark(1);
    ca.free(cr);
}